

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::internal::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  fp y;
  fp x;
  fp x_00;
  float_specs specs_00;
  float_specs specs_01;
  float_specs specs_02;
  int iVar1;
  char *pcVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong divisor;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  int in_EDI;
  bool bVar5;
  fp fVar6;
  fp value_00;
  fp value_01;
  undefined8 unaff_retaddr;
  undefined2 in_stack_00000008;
  undefined8 in_stack_0000000a;
  result result_1;
  grisu_shortest_handler handler_1;
  fp cached_pow_1;
  boundaries boundaries;
  fp fp_value;
  int num_digits;
  fixed_handler handler;
  fp cached_pow;
  fp normalized;
  int cached_exp10;
  int min_exp;
  int exp;
  bool fixed;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result;
  uint64_t fractional;
  uint32_t integral;
  fp one;
  char digit_3;
  uint64_t remainder_1;
  anon_class_16_2_fdf32556 divmod_integral_1;
  uint32_t digit_2;
  result result_2;
  uint64_t fractional_1;
  uint32_t integral_1;
  fp one_1;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 uVar8;
  undefined2 in_stack_fffffffffffffce0;
  undefined2 uVar9;
  undefined6 in_stack_fffffffffffffce2;
  undefined2 in_stack_fffffffffffffce8;
  undefined2 in_stack_fffffffffffffcea;
  int in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  uint64_t in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  fixed_handler *in_stack_fffffffffffffd08;
  uint64_t in_stack_fffffffffffffd10;
  fixed_handler *in_stack_fffffffffffffd18;
  int local_2e0;
  char in_stack_fffffffffffffd27;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  char *in_stack_fffffffffffffd30;
  undefined2 in_stack_fffffffffffffd38;
  ushort uVar10;
  fp *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined2 in_stack_fffffffffffffd58;
  fp *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined2 in_stack_fffffffffffffd98;
  undefined2 uVar11;
  undefined6 uStack_266;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  boundaries local_220;
  fp local_210;
  int local_1fc;
  undefined8 local_1f8;
  significand_type local_1f0;
  undefined8 local_1e8;
  char *local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  byte local_1cc;
  significand_type local_1c8;
  int local_1c0;
  significand_type local_1b8;
  undefined8 uStack_1b0;
  significand_type local_1a8;
  undefined8 uStack_1a0;
  significand_type local_198;
  int local_190;
  significand_type local_188;
  int local_180;
  significand_type local_178;
  int iStack_170;
  undefined4 uStack_16c;
  significand_type local_168;
  int local_160;
  internal *local_158;
  uint local_150;
  significand_type local_148;
  int iStack_140;
  undefined4 uStack_13c;
  int local_130;
  undefined4 local_12c;
  int local_128 [3];
  undefined1 local_11b;
  undefined1 local_11a;
  byte local_119;
  buffer<char> *local_118;
  int local_10c;
  longdouble local_108;
  undefined8 local_f0;
  int local_e8;
  char local_e1;
  long local_e0;
  anon_class_16_2_fdf32556 local_d8;
  uint32_t local_c8;
  result local_c4;
  ulong local_c0;
  uint32_t local_b4;
  fp local_b0;
  char **local_a0;
  int *local_98;
  long local_90;
  significand_type local_88;
  int local_80;
  result local_78;
  char local_71;
  long local_70;
  anon_class_16_2_fdf32556 local_68;
  uint32_t local_58;
  result local_54;
  ulong local_50;
  uint32_t local_44;
  fp local_40;
  grisu_shortest_handler *local_30;
  int *local_28;
  long local_20;
  fixed_handler *local_18;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  
  local_108 = (longdouble)CONCAT82(in_stack_0000000a,in_stack_00000008);
  local_f0._4_1_ = (char)((ulong)in_RSI >> 0x20);
  local_119 = local_f0._4_1_ == '\x02';
  local_118 = in_RDX;
  local_10c = in_EDI;
  if ((longdouble)0 < local_108) {
    iVar1 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    if (((uint)((ulong)in_RSI >> 0x34) & 1) == 0) {
      specs_00._4_4_ = in_stack_fffffffffffffdb0;
      specs_00.precision = in_stack_fffffffffffffdac;
      local_e8 = snprintf_float<long_double>
                           ((longdouble)
                            CONCAT28(in_stack_fffffffffffffd98,
                                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)),
                            iVar1,specs_00,
                            (buffer<char> *)
                            CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    }
    else {
      local_128[0] = 0;
      local_12c = 0xffffffc4;
      local_130 = 0;
      local_f0 = in_RSI;
      if (in_EDI == -1) {
        fp::fp(&local_210);
        uVar9 = (undefined2)((unkuint10)local_108 >> 0x40);
        uVar7 = SUB104(local_108,0);
        uVar8 = (undefined4)((unkuint10)local_108 >> 0x20);
        if ((local_f0._4_4_ >> 0x13 & 1) == 0) {
          local_220 = fp::assign_with_boundaries<long_double>
                                (in_stack_fffffffffffffd40,
                                 (longdouble)
                                 CONCAT28(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30));
          uVar3 = local_220.upper;
        }
        else {
          local_220 = fp::assign_float_with_boundaries<long_double>
                                (in_stack_fffffffffffffd60,
                                 (longdouble)
                                 CONCAT28(in_stack_fffffffffffffd58,
                                          CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50)));
          uVar3 = local_220.upper;
        }
        value_01._8_8_ = uVar3;
        value_01.f = (ulong)(uint)local_210.e;
        fVar6 = normalize<0>((internal *)local_210.f,value_01);
        local_210.f = fVar6.f;
        local_210.e = fVar6.e;
        fVar6 = get_cached_power(in_stack_fffffffffffffcf4,
                                 (int *)CONCAT44(in_stack_fffffffffffffcec,
                                                 CONCAT22(in_stack_fffffffffffffcea,
                                                          in_stack_fffffffffffffce8)));
        uVar11 = (undefined2)fVar6.f;
        uStack_266 = fVar6.f._2_6_;
        x_00.f._2_2_ = in_stack_fffffffffffffcea;
        x_00.f._0_2_ = in_stack_fffffffffffffce8;
        x_00.f._4_4_ = in_stack_fffffffffffffcec;
        x_00.e = in_stack_fffffffffffffcf0;
        x_00._12_4_ = in_stack_fffffffffffffcf4;
        fVar6.f._4_4_ = uVar8;
        fVar6.f._0_4_ = uVar7;
        fVar6.e._0_2_ = uVar9;
        fVar6._10_6_ = in_stack_fffffffffffffce2;
        fVar6 = operator*(x_00,fVar6);
        local_210.f = fVar6.f;
        local_210.e = fVar6.e;
        uVar3 = multiply(local_220.lower,CONCAT62(uStack_266,uVar11));
        uVar4 = multiply(local_220.upper,CONCAT62(uStack_266,uVar11));
        buffer<char>::data(local_118);
        uVar10 = 0;
        fp::fp((fp *)&stack0xfffffffffffffd18,uVar4 + 1,local_210.e);
        local_20 = (uVar4 + 1) - (uVar3 - 1);
        local_28 = local_128;
        local_30 = (grisu_shortest_handler *)&stack0xfffffffffffffd30;
        local_18 = in_stack_fffffffffffffd18;
        fp::fp(&local_40,1L << (-(char)local_2e0 & 0x3fU),local_2e0);
        local_44 = (uint32_t)((ulong)local_18 >> (-(char)local_40.e & 0x3fU));
        local_50 = (ulong)local_18 & local_40.f - 1;
        iVar1 = count_digits(local_44);
        *local_28 = iVar1;
        local_54 = grisu_shortest_handler::on_start
                             (local_30,*(long *)(basic_data<void>::powers_of_10_64 +
                                                (long)(*local_28 + -1) * 8) <<
                                       (-(char)local_40.e & 0x3fU),(ulong)local_18 / 10,
                              local_20 * 10,local_28);
        if (local_54 == more) {
          do {
            local_54 = 0;
            local_58 = 0;
            local_68.digit = &local_58;
            local_68.integral = &local_44;
            switch(*local_28) {
            case 1:
              local_58 = local_44;
              local_44 = 0;
              break;
            case 2:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,10);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,100);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,1000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,10000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,100000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,1000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,10000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,100000000);
              break;
            case 10:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,1000000000);
            }
            *local_28 = *local_28 + -1;
            local_70 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
            uVar7 = 1;
            local_54 = grisu_shortest_handler::on_digit
                                 ((grisu_shortest_handler *)
                                  CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                  in_stack_fffffffffffffd27,(uint64_t)in_stack_fffffffffffffd18,
                                  in_stack_fffffffffffffd10,(uint64_t)in_stack_fffffffffffffd08,
                                  in_stack_fffffffffffffd04,
                                  SUB41((uint)in_stack_fffffffffffffd00 >> 0x18,0));
            if (local_54 != more) goto LAB_002bd854;
          } while (0 < *local_28);
          do {
            local_54 = 0;
            local_20 = local_20 * 10;
            local_71 = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
            local_50 = local_40.f - 1 & local_50 * 10;
            *local_28 = *local_28 + -1;
            uVar7 = 0;
            local_54 = grisu_shortest_handler::on_digit
                                 ((grisu_shortest_handler *)
                                  CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                  in_stack_fffffffffffffd27,(uint64_t)in_stack_fffffffffffffd18,
                                  in_stack_fffffffffffffd10,(uint64_t)in_stack_fffffffffffffd08,
                                  in_stack_fffffffffffffd04,
                                  SUB41((uint)in_stack_fffffffffffffd00 >> 0x18,0));
          } while (local_54 == more);
        }
LAB_002bd854:
        if (local_54 == error) {
          local_128[0] = ((uint)uVar10 - local_130) + -1 + local_128[0];
          fallback_format<long_double>
                    ((longdouble)CONCAT28(in_stack_00000008,unaff_retaddr),
                     (buffer<char> *)CONCAT44(2,in_stack_fffffffffffffff8),
                     (int *)CONCAT44(in_stack_fffffffffffffff4,local_2e0));
          return local_128[0];
        }
        to_unsigned<int>((uint)uVar10);
        buffer<char>::resize
                  ((buffer<char> *)CONCAT62(in_stack_fffffffffffffce2,uVar9),CONCAT44(uVar8,uVar7));
      }
      else {
        if (0x11 < in_EDI) {
          specs_01._4_4_ = in_stack_fffffffffffffdb0;
          specs_01.precision = in_stack_fffffffffffffdac;
          iVar1 = snprintf_float<long_double>
                            ((longdouble)
                             CONCAT28(in_stack_fffffffffffffd98,
                                      CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))
                             ,iVar1,specs_01,
                             (buffer<char> *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
          return iVar1;
        }
        uVar7 = SUB104(local_108,0);
        uVar8 = (undefined4)((ulong)in_stack_0000000a >> 0x10);
        uVar9 = (undefined2)((ulong)in_stack_0000000a >> 0x30);
        fp::fp<long_double>((fp *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                            (longdouble)
                            CONCAT28(in_stack_fffffffffffffce8,
                                     CONCAT62(in_stack_fffffffffffffce2,uVar9)));
        value_00.f = (ulong)local_150;
        value_00._8_8_ = extraout_RDX;
        fVar6 = normalize<0>(local_158,value_00);
        local_168 = fVar6.f;
        local_160 = fVar6.e;
        local_148 = local_168;
        iStack_140 = local_160;
        fVar6 = get_cached_power(in_stack_fffffffffffffcf4,
                                 (int *)CONCAT44(in_stack_fffffffffffffcec,
                                                 CONCAT22(in_stack_fffffffffffffcea,
                                                          in_stack_fffffffffffffce8)));
        local_1b8 = fVar6.f;
        local_180 = fVar6.e;
        uStack_1a0 = CONCAT44(uStack_13c,iStack_140);
        local_1a8 = local_148;
        uStack_1b0 = CONCAT44(uStack_16c,local_180);
        x.f._2_2_ = in_stack_fffffffffffffcea;
        x.f._0_2_ = in_stack_fffffffffffffce8;
        x.f._4_4_ = in_stack_fffffffffffffcec;
        x.e = in_stack_fffffffffffffcf0;
        x._12_4_ = in_stack_fffffffffffffcf4;
        y.f._4_4_ = uVar8;
        y.f._0_4_ = uVar7;
        y.e._0_2_ = uVar9;
        y._10_6_ = in_stack_fffffffffffffce2;
        local_188 = local_1b8;
        local_178 = local_1b8;
        iStack_170 = local_180;
        fVar6 = operator*(x,y);
        local_1c8 = fVar6.f;
        local_1c0 = fVar6.e;
        local_198 = local_1c8;
        local_190 = local_1c0;
        local_148 = local_1c8;
        iStack_140 = local_1c0;
        local_1e0 = buffer<char>::data(local_118);
        local_1d8 = 0;
        local_1d4 = local_10c;
        local_1d0 = -local_130;
        local_1cc = local_119 & 1;
        local_1f0 = local_148;
        local_1e8 = CONCAT44(uStack_13c,iStack_140);
        local_88 = local_148;
        local_80 = iStack_140;
        local_90 = 1;
        local_98 = local_128;
        local_a0 = &local_1e0;
        fp::fp(&local_b0,1L << (-(char)iStack_140 & 0x3fU),iStack_140);
        local_b4 = (uint32_t)(local_88 >> (-(char)local_b0.e & 0x3fU));
        local_c0 = local_88 & local_b0.f - 1;
        iVar1 = count_digits(local_b4);
        *local_98 = iVar1;
        local_78 = fixed_handler::on_start
                             (in_stack_fffffffffffffd08,
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              in_stack_fffffffffffffcf8,
                              CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                              (int *)CONCAT44(in_stack_fffffffffffffcec,
                                              CONCAT22(in_stack_fffffffffffffcea,
                                                       in_stack_fffffffffffffce8)));
        iVar1 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
        if (local_78 == more) {
          do {
            local_c4 = 0;
            local_c8 = 0;
            local_d8.digit = &local_c8;
            local_d8.integral = &local_b4;
            divisor = (ulong)(*local_98 - 1);
            switch(divisor) {
            case 0:
              local_c8 = local_b4;
              local_b4 = 0;
              break;
            case 1:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,10);
              break;
            case 2:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,100);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,1000);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,10000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,100000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,1000000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,10000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,100000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,1000000000);
            }
            *local_98 = *local_98 + -1;
            local_e0 = ((ulong)local_b4 << (-(char)local_b0.e & 0x3fU)) + local_c0;
            uVar7 = 1;
            local_78 = fixed_handler::on_digit
                                 (in_stack_fffffffffffffd18,
                                  (char)(in_stack_fffffffffffffd10 >> 0x38),divisor,
                                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                  in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                                  SUB41((uint)in_stack_fffffffffffffcf0 >> 0x18,0));
            iVar1 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
            if (local_78 != more) goto LAB_002bd0d6;
          } while (0 < *local_98);
          do {
            local_c4 = 0;
            local_90 = local_90 * 10;
            local_e1 = (char)(local_c0 * 10 >> (-(char)local_b0.e & 0x3fU)) + '0';
            local_c0 = local_b0.f - 1 & local_c0 * 10;
            *local_98 = *local_98 + -1;
            uVar7 = 0;
            local_78 = fixed_handler::on_digit
                                 (in_stack_fffffffffffffd18,
                                  (char)(in_stack_fffffffffffffd10 >> 0x38),divisor,
                                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                  in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                                  SUB41((uint)in_stack_fffffffffffffcf0 >> 0x18,0));
            iVar1 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
          } while (local_78 == more);
        }
LAB_002bd0d6:
        local_c4 = local_78;
        if (local_78 == error) {
          local_1f8 = local_f0;
          specs_02._4_4_ = in_stack_fffffffffffffdb0;
          specs_02.precision = in_stack_fffffffffffffdac;
          iVar1 = snprintf_float<long_double>
                            ((longdouble)
                             CONCAT28(in_stack_fffffffffffffd98,
                                      CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))
                             ,iVar1,specs_02,
                             (buffer<char> *)
                             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
          return iVar1;
        }
        local_1fc = local_1d8;
        if ((local_119 & 1) == 0) {
          while( true ) {
            bVar5 = false;
            if (0 < local_1fc) {
              pcVar2 = buffer<char>::operator[](local_118,(long)(local_1fc + -1));
              bVar5 = *pcVar2 == '0';
            }
            if (!bVar5) break;
            local_1fc = local_1fc + -1;
            local_128[0] = local_128[0] + 1;
          }
        }
        to_unsigned<int>(local_1fc);
        buffer<char>::resize
                  ((buffer<char> *)CONCAT62(in_stack_fffffffffffffce2,uVar9),CONCAT44(uVar8,uVar7));
      }
      local_e8 = local_128[0] - local_130;
    }
  }
  else if ((in_EDI < 1) || (!(bool)local_119)) {
    local_11a = 0x30;
    buffer<char>::push_back
              ((buffer<char> *)CONCAT62(in_stack_fffffffffffffce2,in_stack_fffffffffffffce0),
               (char *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    local_e8 = 0;
  }
  else {
    to_unsigned<int>(in_EDI);
    buffer<char>::resize
              ((buffer<char> *)CONCAT62(in_stack_fffffffffffffce2,in_stack_fffffffffffffce0),
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    buffer<char>::data(local_118);
    local_11b = 0x30;
    std::uninitialized_fill_n<char*,int,char>
              ((char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffcec,
               (char *)CONCAT62(in_stack_fffffffffffffce2,in_stack_fffffffffffffce0));
    local_e8 = -local_10c;
  }
  return local_e8;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>(), "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision != -1) {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  } else {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  }
  return exp - cached_exp10;
}